

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O3

int __thiscall
duckdb_re2::ToStringWalker::PostVisit
          (ToStringWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  size_type sVar1;
  ostringstream *this_00;
  uint uVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  CharClass *this_01;
  string *psVar6;
  Rune *pRVar7;
  long lVar8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [104];
  ios_base local_130 [264];
  
  switch(re->op_) {
  case '\x01':
    psVar6 = this->t_;
    break;
  case '\x02':
    if (3 < parent_arg) {
      return 0;
    }
    psVar6 = this->t_;
    break;
  case '\x03':
    AppendLiteral(this->t_,(re->arguments).rune_,(bool)((byte)re->parse_flags_ & 1));
    goto switchD_01cb33df_default;
  case '\x04':
    if (0 < (re->arguments).repeat.max_) {
      lVar8 = 0;
      do {
        AppendLiteral(this->t_,*(Rune *)((long)&(((re->arguments).capture.name_)->_M_dataplus)._M_p
                                        + lVar8 * 4),(bool)((byte)re->parse_flags_ & 1));
        lVar8 = lVar8 + 1;
      } while (lVar8 < (re->arguments).repeat.max_);
    }
    if (1 < parent_arg) goto switchD_01cb33df_default;
    goto LAB_01cb3712;
  case '\x05':
    if (parent_arg < 2) goto LAB_01cb3712;
    goto switchD_01cb33df_default;
  case '\x06':
    psVar6 = this->t_;
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    sVar4 = psVar6->_M_string_length;
    if (pcVar3[sVar4 - 1] == '|') {
      sVar1 = sVar4 - 1;
      if (sVar4 == 0) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   sVar1,0);
      }
      psVar6->_M_string_length = sVar1;
      pcVar3[sVar1] = '\0';
    }
    else {
      this_00 = (ostringstream *)(local_1a8 + 8);
      local_1a8[0] = 0;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Bad final char: ",0x10)
      ;
      std::ostream::_M_insert<void_const*>(this_00);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_130);
    }
    if (parent_arg < 3) goto LAB_01cb3712;
    goto switchD_01cb33df_default;
  case '\a':
    psVar6 = this->t_;
    goto LAB_01cb35eb;
  case '\b':
    psVar6 = this->t_;
    goto LAB_01cb35eb;
  case '\t':
    psVar6 = this->t_;
LAB_01cb35eb:
    std::__cxx11::string::append((char *)psVar6);
LAB_01cb35f0:
    if ((re->parse_flags_ & 0x40) != 0) {
      std::__cxx11::string::append((char *)this->t_);
    }
    if (0 < parent_arg) goto switchD_01cb33df_default;
LAB_01cb3712:
    psVar6 = this->t_;
    goto LAB_01cb373b;
  case '\n':
    uVar2 = (re->arguments).repeat.max_;
    if (uVar2 == 0xffffffff) {
      psVar6 = this->t_;
      StringPrintf_abi_cxx11_((string *)local_1a8,"{%d,}",(ulong)(uint)(re->arguments).repeat.min_);
      std::__cxx11::string::_M_append((char *)psVar6,CONCAT71(local_1a8._1_7_,local_1a8[0]));
    }
    else {
      psVar6 = this->t_;
      if ((re->arguments).repeat.min_ == uVar2) {
        StringPrintf_abi_cxx11_((string *)local_1a8,"{%d}",(ulong)uVar2);
        std::__cxx11::string::_M_append((char *)psVar6,CONCAT71(local_1a8._1_7_,local_1a8[0]));
      }
      else {
        StringPrintf_abi_cxx11_((string *)local_1a8,"{%d,%d}");
        std::__cxx11::string::_M_append((char *)psVar6,CONCAT71(local_1a8._1_7_,local_1a8[0]));
      }
    }
    if ((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != local_198) {
      operator_delete((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]));
    }
    goto LAB_01cb35f0;
  case '\v':
    psVar6 = this->t_;
    break;
  case '\f':
    psVar6 = this->t_;
    break;
  case '\r':
    psVar6 = this->t_;
    break;
  case '\x0e':
    psVar6 = this->t_;
    break;
  case '\x0f':
    psVar6 = this->t_;
    break;
  case '\x10':
    psVar6 = this->t_;
    break;
  case '\x11':
    psVar6 = this->t_;
    break;
  case '\x12':
    psVar6 = this->t_;
    break;
  case '\x13':
    psVar6 = this->t_;
    break;
  case '\x14':
    psVar6 = this->t_;
    if (*(int *)((re->arguments).char_class.cc_ + 4) != 0) {
      std::__cxx11::string::append((char *)psVar6);
      this_01 = (re->arguments).char_class.cc_;
      bVar5 = CharClass::Contains(this_01,0xfffe);
      if ((bVar5) && (*(int *)(this_01 + 4) != 0x110000)) {
        this_01 = CharClass::Negate(this_01);
        std::__cxx11::string::append((char *)this->t_);
      }
      if (*(int *)(this_01 + 0x10) != 0) {
        pRVar7 = *(Rune **)(this_01 + 8);
        do {
          AppendCCRange(this->t_,*pRVar7,pRVar7[1]);
          pRVar7 = pRVar7 + 2;
        } while (pRVar7 != (Rune *)((long)*(int *)(this_01 + 0x10) * 8 + *(long *)(this_01 + 8)));
      }
      if (this_01 != (re->arguments).char_class.cc_) {
        CharClass::Delete(this_01);
      }
      psVar6 = this->t_;
    }
    break;
  case '\x15':
    psVar6 = this->t_;
    StringPrintf_abi_cxx11_
              ((string *)local_1a8,"(?HaveMatch:%d)",(ulong)(uint)(re->arguments).repeat.max_);
    std::__cxx11::string::_M_append((char *)psVar6,CONCAT71(local_1a8._1_7_,local_1a8[0]));
    if ((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != local_198) {
      operator_delete((undefined1 *)CONCAT71(local_1a8._1_7_,local_1a8[0]));
    }
  default:
    goto switchD_01cb33df_default;
  }
  std::__cxx11::string::append((char *)psVar6);
switchD_01cb33df_default:
  if (parent_arg == 3) {
    psVar6 = this->t_;
LAB_01cb373b:
    std::__cxx11::string::append((char *)psVar6);
  }
  return 0;
}

Assistant:

int ToStringWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                              int* child_args, int nchild_args) {
  int prec = parent_arg;
  switch (re->op()) {
    case kRegexpNoMatch:
      // There's no simple symbol for "no match", but
      // [^0-Runemax] excludes everything.
      t_->append("[^\\x00-\\x{10ffff}]");
      break;

    case kRegexpEmptyMatch:
      // Append (?:) to make empty string visible,
      // unless this is already being parenthesized.
      if (prec < PrecEmpty)
        t_->append("(?:)");
      break;

    case kRegexpLiteral:
      AppendLiteral(t_, re->rune(),
                    (re->parse_flags() & Regexp::FoldCase) != 0);
      break;

    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++)
        AppendLiteral(t_, re->runes()[i],
                      (re->parse_flags() & Regexp::FoldCase) != 0);
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpConcat:
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpAlternate:
      // Clumsy but workable: the children all appended |
      // at the end of their strings, so just remove the last one.
      if ((*t_)[t_->size()-1] == '|')
        t_->erase(t_->size()-1);
      else
        LOG(DFATAL) << "Bad final char: " << t_;
      if (prec < PrecAlternate)
        t_->append(")");
      break;

    case kRegexpStar:
      t_->append("*");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpPlus:
      t_->append("+");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpQuest:
      t_->append("?");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpRepeat:
      if (re->max() == -1)
        t_->append(StringPrintf("{%d,}", re->min()));
      else if (re->min() == re->max())
        t_->append(StringPrintf("{%d}", re->min()));
      else
        t_->append(StringPrintf("{%d,%d}", re->min(), re->max()));
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpAnyChar:
      t_->append(".");
      break;

    case kRegexpAnyByte:
      t_->append("\\C");
      break;

    case kRegexpBeginLine:
      t_->append("^");
      break;

    case kRegexpEndLine:
      t_->append("$");
      break;

    case kRegexpBeginText:
      t_->append("(?-m:^)");
      break;

    case kRegexpEndText:
      if (re->parse_flags() & Regexp::WasDollar)
        t_->append("(?-m:$)");
      else
        t_->append("\\z");
      break;

    case kRegexpWordBoundary:
      t_->append("\\b");
      break;

    case kRegexpNoWordBoundary:
      t_->append("\\B");
      break;

    case kRegexpCharClass: {
      if (re->cc()->size() == 0) {
        t_->append("[^\\x00-\\x{10ffff}]");
        break;
      }
      t_->append("[");
      // Heuristic: show class as negated if it contains the
      // non-character 0xFFFE and yet somehow isn't full.
      CharClass* cc = re->cc();
      if (cc->Contains(0xFFFE) && !cc->full()) {
        cc = cc->Negate();
        t_->append("^");
      }
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i)
        AppendCCRange(t_, i->lo, i->hi);
      if (cc != re->cc())
        cc->Delete();
      t_->append("]");
      break;
    }

    case kRegexpCapture:
      t_->append(")");
      break;

    case kRegexpHaveMatch:
      // There's no syntax accepted by the parser to generate
      // this node (it is generated by RE2::Set) so make something
      // up that is readable but won't compile.
      t_->append(StringPrintf("(?HaveMatch:%d)", re->match_id()));
      break;
  }

  // If the parent is an alternation, append the | for it.
  if (prec == PrecAlternate)
    t_->append("|");

  return 0;
}